

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

bool jessilib::equalsi<char,char32_t>
               (basic_string_view<char,_std::char_traits<char>_> lhs,
               basic_string_view<char32_t,_std::char_traits<char32_t>_> rhs)

{
  wchar32 wVar1;
  char32_t cVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  jessilib *this;
  char *pcVar6;
  char *pcVar7;
  decode_result dVar8;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  
  pcVar7 = lhs._M_str;
  this = (jessilib *)lhs._M_len;
  pcVar6 = (char *)rhs._M_len;
  if (this != (jessilib *)0x0) {
    pcVar5 = (char *)0x0;
    pcVar4 = pcVar6;
    do {
      if (pcVar6 == pcVar5) {
        return false;
      }
      in_string._M_str = pcVar4;
      in_string._M_len = (size_t)pcVar7;
      dVar8 = decode_codepoint_utf8<char>(this,in_string);
      sVar3 = dVar8.units;
      if (sVar3 == 0) {
        return false;
      }
      wVar1 = rhs._M_str[(long)pcVar5];
      if (dVar8.codepoint != wVar1) {
        cVar2 = jessilib::fold(dVar8.codepoint);
        dVar8 = (decode_result)jessilib::fold(wVar1);
        if (cVar2 != dVar8.codepoint) {
          return false;
        }
      }
      pcVar4 = (char *)dVar8.units;
      pcVar7 = pcVar7 + sVar3;
      pcVar5 = pcVar5 + 1;
      this = this + -sVar3;
    } while (this != (jessilib *)0x0);
    pcVar6 = pcVar6 + -(long)pcVar5;
  }
  return pcVar6 == (char *)0x0;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}